

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsBody.cpp
# Opt level: O2

void __thiscall
chrono::ChLoadBodyBodyBushingMate::ComputeBodyBodyForceTorque
          (ChLoadBodyBodyBushingMate *this,ChFrameMoving<double> *rel_AB,ChVector<double> *loc_force
          ,ChVector<double> *loc_torque)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  bool bVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double angle_rot;
  ChVector<double> dir_rot;
  double local_90;
  double local_88;
  double dStack_80;
  undefined1 local_78 [16];
  double local_68;
  ChVector<double> local_58;
  ChQuaternion<double> local_40;
  
  ChLoadBodyBodyBushingSpherical::ComputeBodyBodyForceTorque
            (&this->super_ChLoadBodyBodyBushingSpherical,rel_AB,loc_force,loc_torque);
  local_40.m_data[0] = (rel_AB->super_ChFrame<double>).coord.rot.m_data[0];
  local_40.m_data[1] = (rel_AB->super_ChFrame<double>).coord.rot.m_data[1];
  local_40.m_data[2] = (rel_AB->super_ChFrame<double>).coord.rot.m_data[2];
  local_40.m_data[3] = (rel_AB->super_ChFrame<double>).coord.rot.m_data[3];
  local_68 = 0.0;
  local_78 = ZEXT816(0) << 0x20;
  ChQuaternion<double>::Q_to_AngAxis(&local_40,&local_90,(ChVector<double> *)local_78);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_90;
  uVar4 = vcmpsd_avx512f(ZEXT816(0x400921fb54442d18),auVar8,1);
  bVar5 = (bool)((byte)uVar4 & 1);
  auVar7._0_8_ = (double)((ulong)bVar5 * (long)(local_90 + -6.283185307179586) +
                         (ulong)!bVar5 * (long)local_90);
  auVar7._8_8_ = 0;
  if ((3.141592653589793 < local_90) || (auVar7._0_8_ < -3.141592653589793)) {
    uVar4 = vcmpsd_avx512f(auVar7,ZEXT816(0xc00921fb54442d18),1);
    bVar5 = (bool)((byte)uVar4 & 1);
    local_90 = (double)((ulong)bVar5 * (long)(auVar7._0_8_ + 6.283185307179586) +
                       (ulong)!bVar5 * (long)auVar7._0_8_);
  }
  dVar3 = local_90 * local_68;
  dVar1 = (this->rot_stiffness).m_data[2];
  local_88 = local_90 * (double)local_78._0_8_ * (this->rot_stiffness).m_data[0];
  dStack_80 = local_90 * (double)local_78._8_8_ * (this->rot_stiffness).m_data[1];
  ChFrameMoving<double>::GetWvel_par(&local_58,rel_AB);
  dVar2 = (this->rot_damping).m_data[2];
  dVar6 = (this->rot_damping).m_data[1];
  loc_torque->m_data[0] = local_58.m_data[0] * (this->rot_damping).m_data[0] + local_88;
  loc_torque->m_data[1] = local_58.m_data[1] * dVar6 + dStack_80;
  loc_torque->m_data[2] = local_58.m_data[2] * dVar2 + dVar3 * dVar1;
  return;
}

Assistant:

void ChLoadBodyBodyBushingMate::ComputeBodyBodyForceTorque(const ChFrameMoving<>& rel_AB,
                                                           ChVector<>& loc_force,
                                                           ChVector<>& loc_torque) {
    // inherit parent to compute loc_force = ...
    ChLoadBodyBodyBushingSpherical::ComputeBodyBodyForceTorque(rel_AB, loc_force, loc_torque);

    // compute local torque using small rotations:
    ChQuaternion<> rel_rot = rel_AB.GetRot();

    ChVector<> dir_rot;
    double angle_rot;
    rel_rot.Q_to_AngAxis(angle_rot, dir_rot);
    if (angle_rot > CH_C_PI)
        angle_rot -= CH_C_2PI;
    if (angle_rot < -CH_C_PI)
        angle_rot += CH_C_2PI;
    ChVector<> vect_rot = dir_rot * angle_rot;

    loc_torque = vect_rot * rot_stiffness           // element-wise product!
                 + rel_AB.GetWvel_par() * rot_damping;  // element-wise product!
}